

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

void plutovg_path_traverse
               (plutovg_path_t *path,plutovg_path_traverse_func_t traverse_func,void *closure)

{
  plutovg_path_element_t *ppVar1;
  int iVar2;
  plutovg_path_element_t *ppVar3;
  int iVar4;
  long lVar5;
  plutovg_path_command_t pVar6;
  plutovg_path_element_t *ppVar7;
  int iVar8;
  plutovg_point_t points [3];
  plutovg_path_element_t local_48;
  plutovg_path_element_t local_40;
  plutovg_path_element_t local_38;
  
  iVar2 = (path->elements).size;
  if (0 < iVar2) {
    ppVar3 = (path->elements).data;
    iVar8 = 0;
    do {
      ppVar1 = ppVar3 + iVar8;
      pVar6 = (ppVar1->header).command;
      lVar5 = 8;
      ppVar7 = &local_48;
      if ((pVar6 < PLUTOVG_PATH_COMMAND_CUBIC_TO) || (pVar6 == PLUTOVG_PATH_COMMAND_CLOSE)) {
LAB_00110dd4:
        *ppVar7 = *(plutovg_path_element_t *)((long)ppVar1 + lVar5);
      }
      else if (pVar6 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
        local_48 = ppVar1[1];
        local_40 = ppVar1[2];
        lVar5 = 0x18;
        ppVar7 = &local_38;
        goto LAB_00110dd4;
      }
      iVar8 = iVar8 + *(int *)((long)ppVar1 + 4);
      switch(pVar6) {
      case PLUTOVG_PATH_COMMAND_MOVE_TO:
        pVar6 = PLUTOVG_PATH_COMMAND_MOVE_TO;
        break;
      case PLUTOVG_PATH_COMMAND_LINE_TO:
        pVar6 = PLUTOVG_PATH_COMMAND_LINE_TO;
        break;
      case PLUTOVG_PATH_COMMAND_CUBIC_TO:
        pVar6 = PLUTOVG_PATH_COMMAND_CUBIC_TO;
        iVar4 = 3;
        goto LAB_00110e2a;
      case PLUTOVG_PATH_COMMAND_CLOSE:
        pVar6 = PLUTOVG_PATH_COMMAND_CLOSE;
        break;
      default:
        goto switchD_00110ded_default;
      }
      iVar4 = 1;
LAB_00110e2a:
      (*traverse_func)(closure,pVar6,&local_48.point,iVar4);
switchD_00110ded_default:
    } while (iVar8 < iVar2);
  }
  return;
}

Assistant:

void plutovg_path_traverse(const plutovg_path_t* path, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    plutovg_path_iterator_t it;
    plutovg_path_iterator_init(&it, path);

    plutovg_point_t points[3];
    while(plutovg_path_iterator_has_next(&it)) {
        switch(plutovg_path_iterator_next(&it, points)) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_MOVE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_LINE_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_LINE_TO, points, 1);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CUBIC_TO, points, 3);
            break;
        case PLUTOVG_PATH_COMMAND_CLOSE:
            traverse_func(closure, PLUTOVG_PATH_COMMAND_CLOSE, points, 1);
            break;
        }
    }
}